

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O0

uint32_t __thiscall
ddd::DictionaryMLT<false,_false>::delete_key(DictionaryMLT<false,_false> *this,char *key)

{
  bool bVar1;
  undefined1 uVar2;
  uint32_t node_pos;
  uint32_t uVar3;
  ulong uVar4;
  size_type sVar5;
  char *in_RSI;
  DaTrie<false,_false,_true> *in_RDI;
  Query *in_stack_00000010;
  DaTrie<false,_false,_false> *in_stack_00000018;
  uint32_t suffix_id;
  uint32_t leaf_pos;
  Query query;
  pointer in_stack_ffffffffffffff78;
  unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
  *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  DaTrie<false,_false,_true> *this_00;
  uint32_t local_4;
  
  this_00 = (DaTrie<false,_false,_true> *)&stack0xffffffffffffffd0;
  Query::Query((Query *)this_00,in_RSI);
  std::
  unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                *)0x17a9ed);
  bVar1 = DaTrie<false,_false,_true>::search_prefix(this_00,(Query *)in_RDI);
  if (bVar1) {
    bVar1 = Query::is_finished((Query *)&stack0xffffffffffffffd0);
    if (bVar1) {
      std::
      unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
      ::operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                    *)0x17aa5d);
      DaTrie<false,_false,_true>::delete_prefix_leaf
                (in_RDI,(Query *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      (in_RDI->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)&(in_RDI->blocks_).
                            super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
                            super__Vector_impl_data._M_start[-1].num_emps + 3);
      local_4 = Query::value((Query *)&stack0xffffffffffffffd0);
    }
    else {
      node_pos = Query::node_pos((Query *)&stack0xffffffffffffffd0);
      uVar3 = Query::value((Query *)&stack0xffffffffffffffd0);
      Query::set_node_pos((Query *)&stack0xffffffffffffffd0,0);
      std::
      vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
      ::operator[]((vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                    *)&(in_RDI->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
      std::
      unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
      ::operator->((unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                    *)0x17aae4);
      uVar2 = DaTrie<false,_false,_false>::delete_key(in_stack_00000018,in_stack_00000010);
      if ((bool)uVar2) {
        std::
        vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
        ::operator[]((vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                      *)&(in_RDI->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
        std::
        unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
        ::operator->((unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                      *)0x17ab35);
        bVar1 = DaTrie<false,_false,_false>::is_empty((DaTrie<false,_false,_false> *)0x17ab3d);
        if (bVar1) {
          Query::set_node_pos((Query *)&stack0xffffffffffffffd0,node_pos);
          std::
          unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
          ::operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                        *)0x17ab67);
          DaTrie<false,_false,_true>::delete_prefix_leaf
                    (in_RDI,(Query *)CONCAT17(uVar2,in_stack_ffffffffffffff98));
          std::
          vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
          ::operator[]((vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                        *)&(in_RDI->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar3);
          std::
          unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
          ::reset(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          uVar4 = (ulong)(uVar3 + 1);
          sVar5 = std::
                  vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                  ::size((vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                          *)&(in_RDI->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (uVar4 == sVar5) {
            std::
            vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
            ::pop_back((vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                        *)0x17abcd);
          }
          else if (uVar3 < *(uint *)&(in_RDI->tail_).super__Vector_base<char,_std::allocator<char>_>
                                     ._M_impl.field_0x10) {
            *(uint32_t *)
             &(in_RDI->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 =
                 uVar3;
          }
        }
        (in_RDI->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((long)&(in_RDI->blocks_).
                              super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
                              super__Vector_impl_data._M_start[-1].num_emps + 3);
        local_4 = Query::value((Query *)&stack0xffffffffffffffd0);
      }
      else {
        local_4 = 0xffffffff;
      }
    }
  }
  else {
    local_4 = 0xffffffff;
  }
  Query::~Query((Query *)&stack0xffffffffffffffd0);
  return local_4;
}

Assistant:

uint32_t delete_key(const char* key) {
    Query query(key);

    if (!prefix_subtrie_->search_prefix(query)) {
      return NOT_FOUND;
    }

    if (query.is_finished()) {
      prefix_subtrie_->delete_prefix_leaf(query);
      --num_keys_;
      return query.value();
    }

    auto leaf_pos = query.node_pos();
    auto suffix_id = query.value();

    query.set_node_pos(ROOT_POS);
    if (!suffix_subtries_[suffix_id]->delete_key(query)) {
      return NOT_FOUND;
    }

    if (suffix_subtries_[suffix_id]->is_empty()) { // update suffix link
      query.set_node_pos(leaf_pos);
      prefix_subtrie_->delete_prefix_leaf(query);
      suffix_subtries_[suffix_id].reset();

      if (suffix_id + 1 == suffix_subtries_.size()) {
        suffix_subtries_.pop_back();
      } else if (suffix_id < suffix_head_) {
        suffix_head_ = suffix_id;
      }
    }

    --num_keys_;
    return query.value();
  }